

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::InlinePass::AddBranchCond
          (InlinePass *this,uint32_t cond_id,uint32_t true_id,uint32_t false_id,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *block_ptr)

{
  IRContext *c;
  Instruction *this_00;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_01;
  pointer *__ptr_1;
  long lVar1;
  undefined1 local_150 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_130;
  undefined1 local_128 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_108;
  undefined1 local_100 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_e0;
  undefined4 local_d8 [2];
  SmallVector<unsigned_int,_2UL> local_d0;
  undefined4 local_a8;
  SmallVector<unsigned_int,_2UL> local_a0;
  undefined4 local_78;
  undefined1 local_70 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this_00 = (Instruction *)operator_new(0x70);
  c = (this->super_Pass).context_;
  local_128._24_8_ = local_128 + 0x10;
  local_128._0_8_ = &PTR__SmallVector_00930a20;
  local_108._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_128._8_8_ = 1;
  local_d8[0] = 1;
  local_d0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00930a20;
  local_d0.size_ = 0;
  local_d0.small_data_ = (uint *)local_d0.buffer;
  local_d0.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_128._16_4_ = cond_id;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (&local_d0,(SmallVector<unsigned_int,_2UL> *)local_128);
  local_150._24_8_ = local_150 + 0x10;
  local_150._0_8_ = &PTR__SmallVector_00930a20;
  local_130._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_150._8_8_ = 1;
  local_a8 = 1;
  local_a0._vptr_SmallVector = (_func_int **)&PTR__SmallVector_00930a20;
  local_a0.size_ = 0;
  local_a0.small_data_ = (uint *)local_a0.buffer;
  local_a0.large_data_._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_150._16_4_ = true_id;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            (&local_a0,(SmallVector<unsigned_int,_2UL> *)local_150);
  local_100._24_8_ = local_100 + 0x10;
  local_100._0_8_ = &PTR__SmallVector_00930a20;
  local_e0._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_100._8_8_ = 1;
  local_78 = 1;
  local_70._0_8_ = &PTR__SmallVector_00930a20;
  local_70._8_8_ = 0;
  local_70._24_8_ = local_70 + 0x10;
  this_01 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_50;
  local_50._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_100._16_4_ = false_id;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)local_70,(SmallVector<unsigned_int,_2UL> *)local_100)
  ;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             local_d8,&local_48);
  Instruction::Instruction(this_00,c,OpBranchConditional,0,0,(OperandList *)&local_48);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  lVar1 = -0x90;
  do {
    *(undefined ***)(this_01 + -0x20) = &PTR__SmallVector_00930a20;
    if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01 !=
        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                (this_01,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01);
    }
    *(undefined8 *)this_01 = 0;
    this_01 = this_01 + -0x30;
    lVar1 = lVar1 + 0x30;
  } while (lVar1 != 0);
  local_100._0_8_ = &PTR__SmallVector_00930a20;
  if (local_e0._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_e0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_e0._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  local_150._0_8_ = &PTR__SmallVector_00930a20;
  if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )local_130._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_130,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_130._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  local_128._0_8_ = &PTR__SmallVector_00930a20;
  if (local_108._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_108,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_108._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            (&(((block_ptr->_M_t).
                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl)->insts_).
              super_IntrusiveList<spvtools::opt::Instruction>,this_00);
  return;
}

Assistant:

void InlinePass::AddBranchCond(uint32_t cond_id, uint32_t true_id,
                               uint32_t false_id,
                               std::unique_ptr<BasicBlock>* block_ptr) {
  std::unique_ptr<Instruction> newBranch(
      new Instruction(context(), spv::Op::OpBranchConditional, 0, 0,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {cond_id}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {true_id}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {false_id}}}));
  (*block_ptr)->AddInstruction(std::move(newBranch));
}